

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  long lVar1;
  CharFormat CVar2;
  char *pcVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  ostream *os_local;
  string *s_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char *)std::__cxx11::string::data();
  sVar4 = std::__cxx11::string::size();
  CVar2 = PrintCharsAsStringTo<char>(pcVar3,sVar4,os);
  if ((CVar2 == kHexEscape) && ((FLAGS_gtest_print_utf8 & 1) != 0)) {
    pcVar3 = (char *)std::__cxx11::string::data();
    sVar4 = std::__cxx11::string::size();
    anon_unknown_91::ConditionalPrintAsText(pcVar3,sVar4,os);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}